

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Length<3>::doExpand
          (Length<3> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_3>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  double __x;
  ExprP<float> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_20;
  
  dot<3>((Functions *)&local_20,in_RCX,in_RCX);
  sqrt((Functions *)this,__x);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_20);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<float>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return sqrt(dot(args.a, args.a));
	}